

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O3

void gravity_function_array_dump(gravity_function_t *f,gravity_value_r r)

{
  gravity_class_t *pgVar1;
  uint uVar2;
  long in_RDX;
  long *plVar3;
  long lVar4;
  long in_RSI;
  char *pcVar5;
  char *__format;
  
  if ((int)f != 0) {
    __assert_fail("f->tag == EXEC_TYPE_NATIVE",
                  "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/shared/gravity_value.c"
                  ,0x244,"void gravity_function_array_dump(gravity_function_t *, gravity_value_r)");
  }
  if (in_RSI != 0) {
    plVar3 = (long *)(in_RDX + 8);
    lVar4 = 0;
    do {
      pgVar1 = (gravity_class_t *)plVar3[-1];
      pcVar5 = (char *)*plVar3;
      if (((ulong)gravity_class_null ^ (ulong)pgVar1) == 0 && pcVar5 == (char *)0x0) {
        pcVar5 = "%05zu\tNULL\n";
LAB_0012bf74:
        printf(pcVar5,lVar4);
      }
      else {
        if (((ulong)gravity_class_null ^ (ulong)pgVar1) == 0 && pcVar5 == (char *)0x1) {
          pcVar5 = "%05zu\tUNDEFINED\n";
          goto LAB_0012bf74;
        }
        if (pgVar1 == gravity_class_bool) {
          uVar2 = (uint)(pcVar5 != (char *)0x0);
          pcVar5 = "%05zu\tBOOL: %d\n";
LAB_0012c030:
          printf(pcVar5,lVar4,(ulong)uVar2);
        }
        else {
          if (pgVar1 == gravity_class_int) {
            __format = "%05zu\tINT: %ld\n";
          }
          else {
            if (pgVar1 == gravity_class_float) {
              printf("%05zu\tFLOAT: %g\n",pcVar5,lVar4);
              goto LAB_0012bf7e;
            }
            if (pgVar1 == gravity_class_function) {
              pcVar5 = *(char **)(pcVar5 + 0x38);
              if (pcVar5 == (char *)0x0) {
                pcVar5 = "$anon";
              }
              __format = "%05zu\tFUNC: %s\n";
            }
            else if (pgVar1 == gravity_class_class) {
              pcVar5 = *(char **)(pcVar5 + 0x38);
              if (pcVar5 == (char *)0x0) {
                pcVar5 = "$anon";
              }
              __format = "%05zu\tCLASS: %s\n";
            }
            else if (pgVar1 == gravity_class_string) {
              pcVar5 = *(char **)(pcVar5 + 0x30);
              __format = "%05zu\tSTRING: %s\n";
            }
            else {
              if (pgVar1 != gravity_class_list) {
                if (pgVar1 != gravity_class_map) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/shared/gravity_value.c"
                                ,0x284,
                                "void gravity_function_array_dump(gravity_function_t *, gravity_value_r)"
                               );
                }
                uVar2 = gravity_hash_count(*(gravity_hash_t **)(pcVar5 + 0x30));
                pcVar5 = "%05zu\tMAP: %u items\n";
                goto LAB_0012c030;
              }
              pcVar5 = *(char **)(pcVar5 + 0x30);
              __format = "%05zu\tLIST: %zu items\n";
            }
          }
          printf(__format,lVar4,pcVar5);
        }
      }
LAB_0012bf7e:
      lVar4 = lVar4 + 1;
      plVar3 = plVar3 + 2;
    } while (in_RSI != lVar4);
  }
  return;
}

Assistant:

static void gravity_function_array_dump (gravity_function_t *f, gravity_value_r r) {
    assert(f->tag == EXEC_TYPE_NATIVE);
    size_t n = marray_size(r);

    for (size_t i=0; i<n; i++) {
        gravity_value_t v = marray_get(r, i);

        if (VALUE_ISA_NULL(v)) {
            printf("%05zu\tNULL\n", i);
            continue;
        }
        
        if (VALUE_ISA_UNDEFINED(v)) {
            printf("%05zu\tUNDEFINED\n", i);
            continue;
        }
        
        if (VALUE_ISA_BOOL(v)) {
            printf("%05zu\tBOOL: %d\n", i, (v.n == 0) ? 0 : 1);
            continue;
        }
        
        if (VALUE_ISA_INT(v)) {
            printf("%05zu\tINT: %" PRId64 "\n", i, (int64_t)v.n);
            continue;
        }
        
        if (VALUE_ISA_FLOAT(v)) {
            printf("%05zu\tFLOAT: %g\n", i, (double)v.f);
            continue;
        }
        
        if (VALUE_ISA_FUNCTION(v)) {
            gravity_function_t *vf = VALUE_AS_FUNCTION(v);
            printf("%05zu\tFUNC: %s\n", i, (vf->identifier) ? vf->identifier : "$anon");
            continue;
        }
        
        if (VALUE_ISA_CLASS(v)) {
            gravity_class_t *c = VALUE_AS_CLASS(v);
            printf("%05zu\tCLASS: %s\n", i, (c->identifier) ? c->identifier: "$anon");
            continue;
            
        }
        
        if (VALUE_ISA_STRING(v)) {
            printf("%05zu\tSTRING: %s\n", i, VALUE_AS_CSTRING(v));
            continue;
        }
        
        if (VALUE_ISA_LIST(v)) {
            gravity_list_t *value = VALUE_AS_LIST(v);
            size_t count = marray_size(value->array);
            printf("%05zu\tLIST: %zu items\n", i, count);
            continue;
            
        }
        
        if (VALUE_ISA_MAP(v)) {
            gravity_map_t *map = VALUE_AS_MAP(v);
            printf("%05zu\tMAP: %u items\n", i, gravity_hash_count(map->hash));
            continue;
        }
        
        // should never reach this point
        assert(0);
    }
}